

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Biquad.cpp
# Opt level: O0

vector<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_> * __thiscall
Iir::Biquad::getPoleZeros(Biquad *this)

{
  value_type *in_RSI;
  vector<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_> *in_RDI;
  BiquadPoleState bps;
  vector<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_> *vpz;
  Biquad *in_stack_00000098;
  BiquadPoleState *in_stack_000000a0;
  vector<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_> *in_stack_ffffffffffffff90;
  
  std::vector<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_>::vector
            ((vector<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_> *)0x109284);
  BiquadPoleState::BiquadPoleState(in_stack_000000a0,in_stack_00000098);
  std::vector<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_>::push_back
            (in_stack_ffffffffffffff90,in_RSI);
  return in_RDI;
}

Assistant:

std::vector<PoleZeroPair> Biquad::getPoleZeros () const
	{
		std::vector<PoleZeroPair> vpz;
		BiquadPoleState bps (*this);
		vpz.push_back (bps);
		return vpz;
	}